

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daemonize.cpp
# Opt level: O2

void __thiscall cppcms::impl::daemonizer::daemonize(daemonizer *this,value *conf)

{
  bool bVar1;
  __pid_t _Var2;
  int iVar3;
  int iVar4;
  group *pgVar5;
  passwd *ppVar6;
  char *__lhs;
  int *piVar7;
  ssize_t sVar8;
  cppcms_error *pcVar9;
  __gid_t __gid;
  __uid_t __uid;
  allocator local_269;
  string pid;
  vector<char,_std::allocator<char>_> buf;
  string lock_file;
  locale local_208 [8];
  string chroot_dir;
  string group;
  string user;
  ostringstream ss;
  
  _Var2 = getppid();
  if (_Var2 != 1) {
    _ss = _ss & 0xffffff00;
    bVar1 = json::value::get<bool>(conf,"daemon.enable",(bool *)&ss);
    if (bVar1) {
      iVar3 = open("/dev/null",2);
      if (iVar3 < 0) {
        piVar7 = __errno_location();
        iVar3 = *piVar7;
        pcVar9 = (cppcms_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&ss,"Failed to open /dev/null",(allocator *)&group);
        cppcms_error::cppcms_error(pcVar9,iVar3,(string *)&ss);
        __cxa_throw(pcVar9,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      json::value::get_abi_cxx11_(&group,conf,"daemon.group","");
      if (group._M_string_length == 0) {
        __gid = 0xffffffff;
      }
      else {
        pgVar5 = getgrnam(group._M_dataplus._M_p);
        if (pgVar5 == (group *)0x0) {
          pcVar9 = (cppcms_error *)__cxa_allocate_exception(0x30);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         "Invalid group ",&group);
          cppcms_error::cppcms_error(pcVar9,(string *)&ss);
          __cxa_throw(pcVar9,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        __gid = pgVar5->gr_gid;
      }
      json::value::get_abi_cxx11_(&user,conf,"daemon.user","");
      if (user._M_string_length == 0) {
        __uid = 0xffffffff;
      }
      else {
        ppVar6 = getpwnam(user._M_dataplus._M_p);
        if (ppVar6 == (passwd *)0x0) {
          pcVar9 = (cppcms_error *)__cxa_allocate_exception(0x30);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         "Invalid user ",&user);
          cppcms_error::cppcms_error(pcVar9,(string *)&ss);
          __cxa_throw(pcVar9,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        __uid = ppVar6->pw_uid;
        if (__gid == 0xffffffff) {
          __gid = ppVar6->pw_gid;
        }
      }
      json::value::get_abi_cxx11_(&chroot_dir,conf,"daemon.chroot","");
      if (chroot_dir._M_string_length != 0) {
        global_urandom_fd = open("/dev/urandom",0);
        if (global_urandom_fd < 0) {
          piVar7 = __errno_location();
          iVar3 = *piVar7;
          pcVar9 = (cppcms_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&ss,"Failed to open /dev/urandom",(allocator *)&lock_file);
          cppcms_error::cppcms_error(pcVar9,iVar3,(string *)&ss);
          __cxa_throw(pcVar9,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        iVar4 = chdir(chroot_dir._M_dataplus._M_p);
        if (iVar4 < 0) {
          piVar7 = __errno_location();
          iVar3 = *piVar7;
          pcVar9 = (cppcms_error *)__cxa_allocate_exception(0x30);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         "Failed to chdir to ",&chroot_dir);
          cppcms_error::cppcms_error(pcVar9,iVar3,(string *)&ss);
          __cxa_throw(pcVar9,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        iVar4 = chroot(chroot_dir._M_dataplus._M_p);
        if (iVar4 < 0) {
          piVar7 = __errno_location();
          iVar3 = *piVar7;
          pcVar9 = (cppcms_error *)__cxa_allocate_exception(0x30);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         "Failed to chroot to ",&chroot_dir);
          cppcms_error::cppcms_error(pcVar9,iVar3,(string *)&ss);
          __cxa_throw(pcVar9,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
      }
      _ss = 0xffffffff;
      iVar4 = json::value::get<int>(conf,"daemon.fdlimit",(int *)&ss);
      if (iVar4 != -1) {
        lock_file._M_dataplus._M_p = (pointer)(long)iVar4;
        lock_file._M_string_length = (size_type)lock_file._M_dataplus._M_p;
        iVar4 = setrlimit(RLIMIT_NOFILE,(rlimit *)&lock_file);
        if (iVar4 < 0) {
          piVar7 = __errno_location();
          iVar3 = *piVar7;
          pcVar9 = (cppcms_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&ss,"Failed to change daemon.fdlimit",(allocator *)&pid);
          cppcms_error::cppcms_error(pcVar9,iVar3,(string *)&ss);
          __cxa_throw(pcVar9,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
      }
      if ((__gid != 0xffffffff) && (iVar4 = setgid(__gid), iVar4 < 0)) {
        piVar7 = __errno_location();
        iVar3 = *piVar7;
        pcVar9 = (cppcms_error *)__cxa_allocate_exception(0x30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                       "Failed setgid to group ",&group);
        cppcms_error::cppcms_error(pcVar9,iVar3,(string *)&ss);
        __cxa_throw(pcVar9,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      if ((__uid != 0xffffffff) && (iVar4 = setuid(__uid), iVar4 < 0)) {
        piVar7 = __errno_location();
        iVar3 = *piVar7;
        pcVar9 = (cppcms_error *)__cxa_allocate_exception(0x30);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                       "Failed setuid to user ",&user);
        cppcms_error::cppcms_error(pcVar9,iVar3,(string *)&ss);
        __cxa_throw(pcVar9,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      json::value::get_abi_cxx11_(&lock_file,conf,"daemon.lock","");
      if (lock_file._M_string_length == 0) {
        iVar4 = -1;
      }
      else {
        if (*lock_file._M_dataplus._M_p != '/') {
          std::vector<char,_std::allocator<char>_>::vector(&buf,0x100,(allocator_type *)&ss);
          while (__lhs = getcwd(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                      super__Vector_impl_data._M_start), __lhs == (char *)0x0) {
            piVar7 = __errno_location();
            iVar4 = *piVar7;
            if (iVar4 != 0x22) {
              pcVar9 = (cppcms_error *)__cxa_allocate_exception(0x30);
              std::__cxx11::string::string((string *)&ss,"getcwd failed",(allocator *)&pid);
              cppcms_error::cppcms_error(pcVar9,iVar4,(string *)&ss);
              __cxa_throw(pcVar9,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
            }
            std::vector<char,_std::allocator<char>_>::resize
                      (&buf,((long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start) * 2);
          }
          std::operator+(&pid,"/",&lock_file);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         __lhs,&pid);
          std::__cxx11::string::operator=((string *)&lock_file,(string *)&ss);
          std::__cxx11::string::~string((string *)&ss);
          std::__cxx11::string::~string((string *)&pid);
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    (&buf.super__Vector_base<char,_std::allocator<char>_>);
        }
        iVar4 = open(lock_file._M_dataplus._M_p,0xc2,0x1b6);
        if (iVar4 < 0) {
          piVar7 = __errno_location();
          iVar3 = *piVar7;
          pcVar9 = (cppcms_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&ss,"Failed to create a lock file",(allocator *)&pid);
          cppcms_error::cppcms_error(pcVar9,iVar3,(string *)&ss);
          __cxa_throw(pcVar9,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        std::__cxx11::string::_M_assign((string *)&this->unlink_file);
      }
      _Var2 = fork();
      if (_Var2 < 0) {
        piVar7 = __errno_location();
        iVar3 = *piVar7;
        pcVar9 = (cppcms_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string((string *)&ss,"Fork failed",(allocator *)&pid);
        cppcms_error::cppcms_error(pcVar9,iVar3,(string *)&ss);
        __cxa_throw(pcVar9,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
      }
      if (_Var2 == 0) {
        _Var2 = getpid();
        this->real_pid = _Var2;
        _Var2 = setsid();
        if (_Var2 < 0) {
          piVar7 = __errno_location();
          iVar3 = *piVar7;
          pcVar9 = (cppcms_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&ss,"setsid failed",(allocator *)&pid);
          cppcms_error::cppcms_error(pcVar9,iVar3,(string *)&ss);
          __cxa_throw(pcVar9,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        _Var2 = fork();
        if (_Var2 < 0) {
          piVar7 = __errno_location();
          iVar3 = *piVar7;
          pcVar9 = (cppcms_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string((string *)&ss,"2nd fork failed",(allocator *)&pid);
          cppcms_error::cppcms_error(pcVar9,iVar3,(string *)&ss);
          __cxa_throw(pcVar9,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
        }
        if (_Var2 == 0) {
          _Var2 = getpid();
          this->real_pid = _Var2;
          dup2(iVar3,0);
          dup2(iVar3,1);
          dup2(iVar3,2);
          close(iVar3);
          chdir("/");
          if (iVar4 != -1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
            std::locale::classic();
            std::ios::imbue(local_208);
            std::locale::~locale(local_208);
            std::ostream::operator<<(&ss,this->real_pid);
            std::__cxx11::stringbuf::str();
            sVar8 = ::write(iVar4,pid._M_dataplus._M_p,
                            CONCAT44(pid._M_string_length._4_4_,(int)pid._M_string_length));
            if ((int)sVar8 != (int)pid._M_string_length) {
              pcVar9 = (cppcms_error *)__cxa_allocate_exception(0x30);
              std::__cxx11::string::string((string *)&buf,"Failed to write to lock file",&local_269)
              ;
              cppcms_error::cppcms_error(pcVar9,(string *)&buf);
              __cxa_throw(pcVar9,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
            }
            close(iVar4);
            std::__cxx11::string::~string((string *)&pid);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
          }
          std::__cxx11::string::~string((string *)&lock_file);
          std::__cxx11::string::~string((string *)&chroot_dir);
          std::__cxx11::string::~string((string *)&user);
          std::__cxx11::string::~string((string *)&group);
          return;
        }
      }
      exit(0);
    }
  }
  return;
}

Assistant:

void daemonizer::daemonize(json::value const &conf)
	{
		if(getppid() == 1)
			return;
		
		if(!conf.get("daemon.enable",false))
			return;
		
		int gid = -1;
		int uid = -1;
		
		int devnull_fd = -1;
		int lock_fd = -1;

		try {
		
			devnull_fd = open("/dev/null",O_RDWR);
			
			if(devnull_fd < 0) {
				int err = errno;
				throw cppcms_error(err,"Failed to open /dev/null");
			}
			
			std::string group = conf.get("daemon.group","");
			if(!group.empty()) {
				struct group *gr = getgrnam(group.c_str());
				if(!gr)
					throw cppcms_error("Invalid group " + group);
				gid = gr->gr_gid;
			}
			
			std::string user = conf.get("daemon.user","");
			if(!user.empty()) {
				struct passwd *pw = getpwnam(user.c_str());
				if(!pw)
					throw cppcms_error("Invalid user " + user);
				uid = pw->pw_uid;
				if(gid==-1)
					gid = pw->pw_gid;
			}
			
			std::string chroot_dir = conf.get("daemon.chroot","");

			if(!chroot_dir.empty()) {
				global_urandom_fd = open("/dev/urandom",O_RDONLY);
				if(global_urandom_fd < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed to open /dev/urandom");
				}

				if(chdir(chroot_dir.c_str()) < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed to chdir to " + chroot_dir);
				}
				if(chroot(chroot_dir.c_str()) < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed to chroot to " + chroot_dir);
				}

			}

			int fd_limit = conf.get("daemon.fdlimit",-1);
			if(fd_limit != -1) {
				struct rlimit lm;
				lm.rlim_cur = fd_limit;
				lm.rlim_max = fd_limit;
				if(setrlimit(RLIMIT_NOFILE,&lm) < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed to change daemon.fdlimit");
				}
			}
			
			if(gid!=-1) {
				if(setgid(gid) < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed setgid to group " + group);
				}
			}

			if(uid!=-1) {
				if(setuid(uid) < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed setuid to user " + user);
				}
			}


			std::string lock_file = conf.get("daemon.lock","");
			if(!lock_file.empty()) {
				if(lock_file[0]!='/') {
					char *wd = 0;
					std::vector<char> buf(256);
					while((wd=getcwd(&buf.front(),buf.size()))==0 && errno==ERANGE)
						buf.resize(buf.size()*2);
					if(!wd) {
						int err=errno;
						throw cppcms_error(err,"getcwd failed");
					}
					lock_file=wd + ("/" + lock_file);
				}
				lock_fd = ::open(lock_file.c_str(),O_RDWR | O_CREAT | O_EXCL,0666);
				if(lock_fd < 0) {
					int err = errno;
					throw cppcms_error(err,"Failed to create a lock file");
				}
				unlink_file = lock_file;
			}

			// forking twice
			int chid = fork();
			if(chid < 0) {
				int err = errno;
				throw cppcms_error(err,"Fork failed");
			}
			if(chid != 0)
				exit(0);
			
			real_pid = getpid();
			
			if(setsid() < 0) {
				int err = errno;
				throw cppcms_error(err,"setsid failed");

			}
			chid = fork();
			if(chid < 0) {
				int err = errno;
				throw cppcms_error(err,"2nd fork failed");
			}
			if(chid != 0)
				exit(0);
			
			real_pid = getpid();

			dup2(devnull_fd,0);
			dup2(devnull_fd,1);
			dup2(devnull_fd,2);

			close(devnull_fd);
			devnull_fd = -1;

			int chdir_r = chdir("/");
			(void)(chdir_r); // shut up GCC

			if(lock_fd!=-1) {
				std::ostringstream ss;
				ss.imbue(std::locale::classic());
				ss << real_pid;
				std::string pid = ss.str();
				int v = write(lock_fd,pid.c_str(),pid.size());
				if(v!=int(pid.size())) {
					throw cppcms_error("Failed to write to lock file");
				}
				close(lock_fd);
				lock_fd = -1;
			}
		}
		catch(...) {
			if(lock_fd >= 0)
				close(lock_fd);
			if(devnull_fd >=0)
				close(devnull_fd);
			if(global_urandom_fd >= 0)
				close(global_urandom_fd);
			throw;
		}
	}